

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_quad_right_triangles(REF_GRID ref_grid)

{
  int iVar1;
  int node0;
  uint uVar2;
  REF_DBL *original;
  REF_INT *sorted_index;
  REF_DBL local_1d8;
  REF_DBL local_1d0;
  double local_1c8;
  REF_DBL local_1c0;
  REF_DBL local_1b8;
  double local_1b0;
  REF_DBL local_1a8;
  REF_DBL local_1a0;
  double local_198;
  REF_DBL local_190;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_INT nodes [27];
  REF_INT new_cell;
  REF_INT tn;
  REF_INT n3_1;
  REF_INT n2_1;
  REF_INT cell_node_1;
  REF_INT t_1;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_INT tri_list_1 [2];
  REF_INT ntri_1;
  REF_INT n1_1;
  REF_INT n0_1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_DBL e1 [3];
  double local_98;
  REF_DBL e0 [3];
  REF_INT i;
  REF_INT n3;
  REF_INT n2;
  REF_INT cell_node;
  REF_INT t;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT tri_list [2];
  REF_INT ntri;
  REF_INT n1;
  REF_INT n0;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT o;
  REF_INT *order;
  REF_INT edge;
  REF_DBL *dots;
  REF_EDGE ref_edge;
  REF_CELL tri;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  tri = (REF_CELL)ref_grid->node;
  ref_edge = (REF_EDGE)ref_grid->cell[3];
  ref_node = (REF_NODE)ref_grid;
  uVar2 = ref_edge_create((REF_EDGE *)&dots,ref_grid);
  if (uVar2 == 0) {
    if (*(int *)dots < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x168
             ,"ref_layer_quad_right_triangles","malloc dots of REF_DBL negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      original = (REF_DBL *)malloc((long)*(int *)dots << 3);
      if (original == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x168,"ref_layer_quad_right_triangles","malloc dots of REF_DBL NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (n1 = 0; n1 < *(int *)dots; n1 = n1 + 1) {
          original[n1] = 2.0;
        }
        if (*(int *)dots < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x169,"ref_layer_quad_right_triangles","malloc order of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          sorted_index = (REF_INT *)malloc((long)*(int *)dots << 2);
          if (sorted_index == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x169,"ref_layer_quad_right_triangles","malloc order of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            for (order._4_4_ = 0; order._4_4_ < *(int *)dots; order._4_4_ = order._4_4_ + 1) {
              iVar1 = *(int *)((long)dots[1] + (long)(order._4_4_ << 1) * 4);
              tri_list[1] = *(REF_INT *)((long)dots[1] + (long)(order._4_4_ * 2 + 1) * 4);
              uVar2 = ref_cell_list_with2((REF_CELL)ref_edge,iVar1,tri_list[1],2,tri_list,&t);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x170,"ref_layer_quad_right_triangles",(ulong)uVar2,"tri with2");
                return uVar2;
              }
              if (tri_list[0] == 2) {
                i = -1;
                for (n3 = 0; n3 < *(int *)((long)&ref_edge->e2n + 4); n3 = n3 + 1) {
                  if (((&(ref_edge[1].node)->n)[n3 + *(int *)&ref_edge->e2n * t] != iVar1) &&
                     ((&(ref_edge[1].node)->n)[n3 + *(int *)&ref_edge->e2n * t] != tri_list[1])) {
                    i = (&(ref_edge[1].node)->n)[n3 + *(int *)&ref_edge->e2n * t];
                  }
                }
                if (i == -1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x17c,"ref_layer_quad_right_triangles","n2 not found");
                  return 1;
                }
                e0[2]._4_4_ = -1;
                for (n3 = 0; n3 < *(int *)((long)&ref_edge->e2n + 4); n3 = n3 + 1) {
                  if (((&(ref_edge[1].node)->n)
                       [n3 + *(int *)&ref_edge->e2n * ref_private_macro_code_rss_1] != iVar1) &&
                     ((&(ref_edge[1].node)->n)
                      [n3 + *(int *)&ref_edge->e2n * ref_private_macro_code_rss_1] != tri_list[1]))
                  {
                    e0[2]._4_4_ = (&(ref_edge[1].node)->n)
                                  [n3 + *(int *)&ref_edge->e2n * ref_private_macro_code_rss_1];
                  }
                }
                if (e0[2]._4_4_ == -1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x185,"ref_layer_quad_right_triangles","n3 not found");
                  return 1;
                }
                for (e0[2]._0_4_ = 0; e0[2]._0_4_ < 3; e0[2]._0_4_ = e0[2]._0_4_ + 1) {
                  e0[(long)e0[2]._0_4_ + -1] =
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + iVar1 * 0xf) * 2) -
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + i * 0xf) * 2);
                }
                for (e0[2]._0_4_ = 0; e0[2]._0_4_ < 3; e0[2]._0_4_ = e0[2]._0_4_ + 1) {
                  *(double *)(&ref_private_macro_code_rss_3 + (long)e0[2]._0_4_ * 2) =
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + tri_list[1] * 0xf) * 2) -
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + i * 0xf) * 2);
                }
                uVar2 = ref_math_normalize(&local_98);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x18b,"ref_layer_quad_right_triangles",(ulong)uVar2,"norm e0");
                  return uVar2;
                }
                uVar2 = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss_3);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x18c,"ref_layer_quad_right_triangles",(ulong)uVar2,"norm e1");
                  return uVar2;
                }
                if (e0[1] * e1[1] + local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0] <= 0.0)
                {
                  local_190 = -(e0[1] * e1[1] +
                               local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0]);
                }
                else {
                  local_190 = e0[1] * e1[1] +
                              local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0];
                }
                original[order._4_4_] = local_190;
                for (e0[2]._0_4_ = 0; e0[2]._0_4_ < 3; e0[2]._0_4_ = e0[2]._0_4_ + 1) {
                  e0[(long)e0[2]._0_4_ + -1] =
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + iVar1 * 0xf) * 2) -
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + e0[2]._4_4_ * 0xf) * 2);
                }
                for (e0[2]._0_4_ = 0; e0[2]._0_4_ < 3; e0[2]._0_4_ = e0[2]._0_4_ + 1) {
                  *(double *)(&ref_private_macro_code_rss_3 + (long)e0[2]._0_4_ * 2) =
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + tri_list[1] * 0xf) * 2) -
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + e0[2]._4_4_ * 0xf) * 2);
                }
                uVar2 = ref_math_normalize(&local_98);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x193,"ref_layer_quad_right_triangles",(ulong)uVar2,"norm e0");
                  return uVar2;
                }
                uVar2 = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss_3);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x194,"ref_layer_quad_right_triangles",(ulong)uVar2,"norm e1");
                  return uVar2;
                }
                if (e0[1] * e1[1] + local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0] <= 0.0)
                {
                  local_198 = -(e0[1] * e1[1] +
                               local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0]);
                }
                else {
                  local_198 = e0[1] * e1[1] +
                              local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0];
                }
                if (local_198 < original[order._4_4_] || local_198 == original[order._4_4_]) {
                  local_1a8 = original[order._4_4_];
                }
                else {
                  if (e0[1] * e1[1] + local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0] <=
                      0.0) {
                    local_1a0 = -(e0[1] * e1[1] +
                                 local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0]);
                  }
                  else {
                    local_1a0 = e0[1] * e1[1] +
                                local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0];
                  }
                  local_1a8 = local_1a0;
                }
                original[order._4_4_] = local_1a8;
                for (e0[2]._0_4_ = 0; e0[2]._0_4_ < 3; e0[2]._0_4_ = e0[2]._0_4_ + 1) {
                  e0[(long)e0[2]._0_4_ + -1] =
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + i * 0xf) * 2) -
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + iVar1 * 0xf) * 2);
                }
                for (e0[2]._0_4_ = 0; e0[2]._0_4_ < 3; e0[2]._0_4_ = e0[2]._0_4_ + 1) {
                  *(double *)(&ref_private_macro_code_rss_3 + (long)e0[2]._0_4_ * 2) =
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + e0[2]._4_4_ * 0xf) * 2) -
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + iVar1 * 0xf) * 2);
                }
                uVar2 = ref_math_normalize(&local_98);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x19b,"ref_layer_quad_right_triangles",(ulong)uVar2,"norm e0");
                  return uVar2;
                }
                uVar2 = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss_3);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x19c,"ref_layer_quad_right_triangles",(ulong)uVar2,"norm e1");
                  return uVar2;
                }
                if (e0[1] * e1[1] + local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0] <= 0.0)
                {
                  local_1b0 = -(e0[1] * e1[1] +
                               local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0]);
                }
                else {
                  local_1b0 = e0[1] * e1[1] +
                              local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0];
                }
                if (local_1b0 < original[order._4_4_] || local_1b0 == original[order._4_4_]) {
                  local_1c0 = original[order._4_4_];
                }
                else {
                  if (e0[1] * e1[1] + local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0] <=
                      0.0) {
                    local_1b8 = -(e0[1] * e1[1] +
                                 local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0]);
                  }
                  else {
                    local_1b8 = e0[1] * e1[1] +
                                local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0];
                  }
                  local_1c0 = local_1b8;
                }
                original[order._4_4_] = local_1c0;
                for (e0[2]._0_4_ = 0; e0[2]._0_4_ < 3; e0[2]._0_4_ = e0[2]._0_4_ + 1) {
                  e0[(long)e0[2]._0_4_ + -1] =
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + i * 0xf) * 2) -
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + tri_list[1] * 0xf) * 2);
                }
                for (e0[2]._0_4_ = 0; e0[2]._0_4_ < 3; e0[2]._0_4_ = e0[2]._0_4_ + 1) {
                  *(double *)(&ref_private_macro_code_rss_3 + (long)e0[2]._0_4_ * 2) =
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + e0[2]._4_4_ * 0xf) * 2) -
                       *(double *)(tri->c2n + (long)(e0[2]._0_4_ + tri_list[1] * 0xf) * 2);
                }
                uVar2 = ref_math_normalize(&local_98);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x1a3,"ref_layer_quad_right_triangles",(ulong)uVar2,"norm e0");
                  return uVar2;
                }
                uVar2 = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss_3);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x1a4,"ref_layer_quad_right_triangles",(ulong)uVar2,"norm e1");
                  return uVar2;
                }
                if (e0[1] * e1[1] + local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0] <= 0.0)
                {
                  local_1c8 = -(e0[1] * e1[1] +
                               local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0]);
                }
                else {
                  local_1c8 = e0[1] * e1[1] +
                              local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0];
                }
                if (local_1c8 < original[order._4_4_] || local_1c8 == original[order._4_4_]) {
                  local_1d8 = original[order._4_4_];
                }
                else {
                  if (e0[1] * e1[1] + local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0] <=
                      0.0) {
                    local_1d0 = -(e0[1] * e1[1] +
                                 local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0]);
                  }
                  else {
                    local_1d0 = e0[1] * e1[1] +
                                local_98 * _ref_private_macro_code_rss_3 + e0[0] * e1[0];
                  }
                  local_1d8 = local_1d0;
                }
                original[order._4_4_] = local_1d8;
              }
            }
            uVar2 = ref_sort_heap_dbl(*(REF_INT *)dots,original,sorted_index);
            if (uVar2 == 0) {
              for (ref_malloc_init_i = 0; ref_malloc_init_i < *(int *)dots;
                  ref_malloc_init_i = ref_malloc_init_i + 1) {
                iVar1 = sorted_index[ref_malloc_init_i];
                if (original[iVar1] <= 0.1736 && original[iVar1] != 0.1736) {
                  node0 = *(int *)((long)dots[1] + (long)(iVar1 << 1) * 4);
                  tri_list_1[1] = *(REF_INT *)((long)dots[1] + (long)(iVar1 * 2 + 1) * 4);
                  uVar2 = ref_cell_list_with2((REF_CELL)ref_edge,node0,tri_list_1[1],2,tri_list_1,
                                              &t_1);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x1b2,"ref_layer_quad_right_triangles",(ulong)uVar2,"tri with2");
                    return uVar2;
                  }
                  if (tri_list_1[0] == 2) {
                    tn = -1;
                    nodes[0x1a] = -1;
                    for (n3_1 = 0; n3_1 < *(int *)((long)&ref_edge->e2n + 4); n3_1 = n3_1 + 1) {
                      if (((&(ref_edge[1].node)->n)[n3_1 + *(int *)&ref_edge->e2n * t_1] != node0)
                         && ((&(ref_edge[1].node)->n)[n3_1 + *(int *)&ref_edge->e2n * t_1] !=
                             tri_list_1[1])) {
                        tn = (&(ref_edge[1].node)->n)[n3_1 + *(int *)&ref_edge->e2n * t_1];
                        nodes[0x1a] = n3_1;
                      }
                    }
                    if (tn == -1) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x1c0,"ref_layer_quad_right_triangles","n2 not found");
                      return 1;
                    }
                    if (nodes[0x1a] == -1) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x1c1,"ref_layer_quad_right_triangles","tn not found");
                      return 1;
                    }
                    new_cell = -1;
                    for (n3_1 = 0; n3_1 < *(int *)((long)&ref_edge->e2n + 4); n3_1 = n3_1 + 1) {
                      if (((&(ref_edge[1].node)->n)
                           [n3_1 + *(int *)&ref_edge->e2n * ref_private_macro_code_rss_11] != node0)
                         && ((&(ref_edge[1].node)->n)
                             [n3_1 + *(int *)&ref_edge->e2n * ref_private_macro_code_rss_11] !=
                             tri_list_1[1])) {
                        new_cell = (&(ref_edge[1].node)->n)
                                   [n3_1 + *(int *)&ref_edge->e2n * ref_private_macro_code_rss_11];
                      }
                    }
                    if (new_cell == -1) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x1ca,"ref_layer_quad_right_triangles","n3 not found");
                      return 1;
                    }
                    iVar1 = nodes[0x1a] + -1;
                    if (nodes[0x1a] + -1 < 0) {
                      iVar1 = nodes[0x1a] + 2;
                    }
                    nodes[0x1a] = iVar1;
                    ref_private_macro_code_rss_13 =
                         (&(ref_edge[1].node)->n)[nodes[0x1a] + *(int *)&ref_edge->e2n * t_1];
                    iVar1 = nodes[0x1a] + 1;
                    if (2 < nodes[0x1a] + 1) {
                      iVar1 = nodes[0x1a] + -2;
                    }
                    nodes[0x1a] = iVar1;
                    ref_private_macro_code_rss_12 =
                         (&(ref_edge[1].node)->n)[nodes[0x1a] + *(int *)&ref_edge->e2n * t_1];
                    iVar1 = nodes[0x1a] + 1;
                    if (2 < nodes[0x1a] + 1) {
                      iVar1 = nodes[0x1a] + -2;
                    }
                    nodes[0x1a] = iVar1;
                    nodes[0] = (&(ref_edge[1].node)->n)[nodes[0x1a] + *(int *)&ref_edge->e2n * t_1];
                    nodes[1] = new_cell;
                    nodes[2] = (&(ref_edge[1].node)->n)[*(int *)&ref_edge->e2n * t_1 + 3];
                    uVar2 = ref_cell_add(*(REF_CELL *)&ref_node->naux,&ref_private_macro_code_rss_13
                                         ,nodes + 0x19);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x1d7,"ref_layer_quad_right_triangles",(ulong)uVar2,"add");
                      return uVar2;
                    }
                    uVar2 = ref_cell_remove((REF_CELL)ref_edge,t_1);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x1d8,"ref_layer_quad_right_triangles",(ulong)uVar2,"remove tri 0");
                      return uVar2;
                    }
                    uVar2 = ref_cell_remove((REF_CELL)ref_edge,ref_private_macro_code_rss_11);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x1d9,"ref_layer_quad_right_triangles",(ulong)uVar2,"remove tri 1");
                      return uVar2;
                    }
                  }
                }
              }
              if (sorted_index != (REF_INT *)0x0) {
                free(sorted_index);
              }
              if (original != (REF_DBL *)0x0) {
                free(original);
              }
              ref_grid_local._4_4_ = ref_edge_free((REF_EDGE)dots);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x1df,"ref_layer_quad_right_triangles",(ulong)ref_grid_local._4_4_,
                       "free edge");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x1a8,"ref_layer_quad_right_triangles",(ulong)uVar2,"sort dots");
              ref_grid_local._4_4_ = uVar2;
            }
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x167,
           "ref_layer_quad_right_triangles",(ulong)uVar2,"orig edges");
    ref_grid_local._4_4_ = uVar2;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_layer_quad_right_triangles(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *dots;
  REF_INT edge, *order, o;
  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  ref_malloc_init(dots, ref_edge_n(ref_edge), REF_DBL, 2.0);
  ref_malloc(order, ref_edge_n(ref_edge), REF_INT);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    REF_INT n0, n1;
    REF_INT ntri, tri_list[2];
    n0 = ref_edge_e2n(ref_edge, 0, edge);
    n1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_cell_list_with2(tri, n0, n1, 2, &ntri, tri_list), "tri with2");
    if (2 == ntri) {
      REF_INT t, cell_node, n2, n3, i;
      REF_DBL e0[3], e1[3];
      t = tri_list[0];
      n2 = REF_EMPTY;
      each_ref_cell_cell_node(tri, cell_node) {
        if (ref_cell_c2n(tri, cell_node, t) != n0 &&
            ref_cell_c2n(tri, cell_node, t) != n1) {
          n2 = ref_cell_c2n(tri, cell_node, t);
        }
      }
      RAS(REF_EMPTY != n2, "n2 not found");
      t = tri_list[1];
      n3 = REF_EMPTY;
      each_ref_cell_cell_node(tri, cell_node) {
        if (ref_cell_c2n(tri, cell_node, t) != n0 &&
            ref_cell_c2n(tri, cell_node, t) != n1) {
          n3 = ref_cell_c2n(tri, cell_node, t);
        }
      }
      RAS(REF_EMPTY != n3, "n3 not found");
      /* n2 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n0) - ref_node_xyz(ref_node, i, n2);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n1) - ref_node_xyz(ref_node, i, n2);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = ABS(ref_math_dot(e0, e1));
      /* n3 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n0) - ref_node_xyz(ref_node, i, n3);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n1) - ref_node_xyz(ref_node, i, n3);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
      /* n0 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n2) - ref_node_xyz(ref_node, i, n0);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n3) - ref_node_xyz(ref_node, i, n0);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
      /* n1 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n2) - ref_node_xyz(ref_node, i, n1);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n3) - ref_node_xyz(ref_node, i, n1);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
    }
  }
  RSS(ref_sort_heap_dbl(ref_edge_n(ref_edge), dots, order), "sort dots");

  for (o = 0; o < ref_edge_n(ref_edge); o++) {
    REF_INT n0, n1;
    REF_INT ntri, tri_list[2];
    edge = order[o];
    if (dots[edge] < 0.1736) { /* sin(10 degrees) */
      n0 = ref_edge_e2n(ref_edge, 0, edge);
      n1 = ref_edge_e2n(ref_edge, 1, edge);

      RSS(ref_cell_list_with2(tri, n0, n1, 2, &ntri, tri_list), "tri with2");
      if (2 == ntri) {
        REF_INT t, cell_node, n2, n3, tn, new_cell;
        REF_INT nodes[REF_CELL_MAX_NODE_PER];
        t = tri_list[0];
        n2 = REF_EMPTY;
        tn = REF_EMPTY;
        each_ref_cell_cell_node(tri, cell_node) {
          if (ref_cell_c2n(tri, cell_node, t) != n0 &&
              ref_cell_c2n(tri, cell_node, t) != n1) {
            n2 = ref_cell_c2n(tri, cell_node, t);
            tn = cell_node;
          }
        }
        RAS(REF_EMPTY != n2, "n2 not found");
        RAS(REF_EMPTY != tn, "tn not found")
        t = tri_list[1];
        n3 = REF_EMPTY;
        each_ref_cell_cell_node(tri, cell_node) {
          if (ref_cell_c2n(tri, cell_node, t) != n0 &&
              ref_cell_c2n(tri, cell_node, t) != n1) {
            n3 = ref_cell_c2n(tri, cell_node, t);
          }
        }
        RAS(REF_EMPTY != n3, "n3 not found");
        tn--;
        if (tn < 0) tn += 3;
        t = tri_list[0];
        nodes[0] = ref_cell_c2n(tri, tn, t);
        tn++;
        if (tn > 2) tn -= 3;
        nodes[1] = ref_cell_c2n(tri, tn, t);
        tn++;
        if (tn > 2) tn -= 3;
        nodes[2] = ref_cell_c2n(tri, tn, t);
        nodes[3] = n3;
        nodes[4] = ref_cell_c2n(tri, 3, t);
        RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell), "add");
        RSS(ref_cell_remove(tri, tri_list[0]), "remove tri 0");
        RSS(ref_cell_remove(tri, tri_list[1]), "remove tri 1");
      }
    }
  }
  ref_free(order);
  ref_free(dots);
  RSS(ref_edge_free(ref_edge), "free edge");
  return REF_SUCCESS;
}